

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,float test_value)

{
  uint uVar1;
  double dVar2;
  float test_value_local;
  Am_Value *this_local;
  
  uVar1 = (uint)this->type;
  if (uVar1 - 2 < 2) {
    this_local._7_1_ = (float)(this->value).long_value != test_value;
  }
  else if (uVar1 == 5) {
    this_local._7_1_ = (this->value).float_value != test_value;
  }
  else if (uVar1 == 0x8006) {
    dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value);
    this_local._7_1_ = dVar2 != (double)test_value;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(float test_value) const
{
  switch (type) {
  case Am_FLOAT:
    return value.float_value != test_value;
  case Am_DOUBLE:
    return (double)*(Am_Double_Data *)value.wrapper_value != test_value;
  case Am_INT:
  case Am_LONG:
    return value.long_value != test_value;
  default:
    return true;
  }
}